

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Journal.h
# Opt level: O3

void __thiscall
beast::Journal::ScopedStream::ScopedStream<char[22]>
          (ScopedStream *this,Stream *stream,char (*t) [22])

{
  Severity SVar1;
  long lVar2;
  size_t sVar3;
  
  SVar1 = stream->m_level;
  this->m_sink = stream->m_sink;
  this->m_level = SVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_ostream);
  lVar2 = *(long *)&this->m_ostream;
  *(uint *)(&this->field_0x28 + *(long *)(lVar2 + -0x18)) =
       *(uint *)(&this->field_0x28 + *(long *)(lVar2 + -0x18)) | 1;
  *(uint *)(&this->field_0x28 + *(long *)(lVar2 + -0x18)) =
       *(uint *)(&this->field_0x28 + *(long *)(lVar2 + -0x18)) | 0x200;
  sVar3 = strlen(*t);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->m_ostream,*t,sVar3);
  return;
}

Assistant:

Journal::ScopedStream::ScopedStream (Journal::Stream const& stream, T const& t)
   : ScopedStream (stream.sink(), stream.level())
{
    m_ostream << t;
}